

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall Console::Console(Console *this)

{
  Console *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Console::Command>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Console::Command>_>_>_>
  ::unordered_map(&this->commands);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->printBuffer);
  registerHelpCommand(this);
  return;
}

Assistant:

Console::Console()
{
    registerHelpCommand();
}